

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O0

Program * parse_program(char **base_source_names)

{
  char **ppcVar1;
  Map *types;
  Queue *q;
  char cVar2;
  Linkage *internal_linkage;
  Translation_Data *translation_data;
  Source_File *src;
  AST *data;
  char *local_48;
  char *this_directory [2];
  Translation_Data *hold_translation_data;
  Program *program;
  Source_File *base_file;
  char **base_source_names_local;
  
  local_48 = "./";
  this_directory[0] = (char *)0x0;
  if (base_source_names != (char **)0x0) {
    if (*base_source_names == (char *)0x0) {
      base_source_names_local = (char **)0x0;
    }
    else {
      base_source_names_local = (char **)get_program();
      types = ((Program *)base_source_names_local)->types;
      internal_linkage = get_linkage();
      translation_data =
           get_translation_data
                     (types,internal_linkage,((Program *)base_source_names_local)->external_linkage)
      ;
      base_file = (Source_File *)base_source_names;
      do {
        src = get_source_file((char *)base_file->src_name,&local_48);
        if (src == (Source_File *)0x0) {
          free((void *)0x0);
        }
        else {
          Queue_Push(translation_data->source_files,src);
          lex(src,translation_data);
          cVar2 = has_new_errors(translation_data);
          if (cVar2 == '\0') {
            q = ((Program *)base_source_names_local)->translation_units;
            data = parse_translation_unit(translation_data);
            Queue_Push(q,data);
          }
          else {
            flush_tokens(translation_data->tokens);
          }
          assimilate_translation_data((Program *)base_source_names_local,translation_data);
        }
        ppcVar1 = &base_file->src;
        base_file = (Source_File *)&base_file->src;
      } while (*ppcVar1 != (char *)0x0);
      delete_translation_data(translation_data);
    }
    return (Program *)base_source_names_local;
  }
  __assert_fail("base_source_names!=NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/program/program.c"
                ,0xb7,"struct Program *parse_program(char **)");
}

Assistant:

struct Program* parse_program(char **base_source_names)
{
	struct Source_File *base_file;
	struct Program *program;
	struct Translation_Data *hold_translation_data;
	char *this_directory[]={"./",NULL};

	assert(base_source_names!=NULL);

	if(*base_source_names==NULL)
	{
		return NULL;
	}

	program=get_program();
	hold_translation_data=get_translation_data(program->types,get_linkage(),program->external_linkage);	
	do
	{
		base_file=get_source_file(*base_source_names,this_directory);
		if(base_file==NULL)
		{
			/*TODO error*/
			free(base_file);
			continue;
		}else
		{
			Queue_Push(hold_translation_data->source_files,base_file);
			lex(base_file,hold_translation_data);
			if(!has_new_errors(hold_translation_data))
			{
				Queue_Push(program->translation_units,parse_translation_unit(hold_translation_data));
			}else
			{
				flush_tokens(hold_translation_data->tokens);
			}
			assimilate_translation_data(program,hold_translation_data);
		}
	}while(*(++base_source_names));
	
	delete_translation_data(hold_translation_data);	
	return program;
}